

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbox_core.cpp
# Opt level: O0

unique_ptr<so_5::abstract_message_box_t,_std::default_delete<so_5::abstract_message_box_t>_>
__thiscall
so_5::impl::(anonymous_namespace)::
make_actual_mbox<so_5::impl::limitful_mpsc_mbox_template<so_5::impl::msg_tracing_helpers::tracing_disabled_base>,so_5::impl::limitful_mpsc_mbox_template<so_5::impl::msg_tracing_helpers::tracing_enabled_base>,unsigned_long_long_const&,so_5::agent_t*&,so_5::message_limit::impl::info_storage_t_const&>
          (_anonymous_namespace_ *this,tracer_t *tracer,unsigned_long_long *args,agent_t **args_1,
          info_storage_t *args_2)

{
  limitful_mpsc_mbox_template<so_5::impl::msg_tracing_helpers::tracing_disabled_base> *this_00;
  limitful_mpsc_mbox_template<so_5::impl::msg_tracing_helpers::tracing_enabled_base> *this_01;
  info_storage_t *args_local_2;
  agent_t **args_local_1;
  unsigned_long_long *args_local;
  tracer_t *tracer_local;
  unique_ptr<so_5::abstract_message_box_t,_std::default_delete<so_5::abstract_message_box_t>_>
  *result;
  
  std::unique_ptr<so_5::abstract_message_box_t,std::default_delete<so_5::abstract_message_box_t>>::
  unique_ptr<std::default_delete<so_5::abstract_message_box_t>,void>
            ((unique_ptr<so_5::abstract_message_box_t,std::default_delete<so_5::abstract_message_box_t>>
              *)this);
  if (tracer == (tracer_t *)0x0) {
    this_00 = (limitful_mpsc_mbox_template<so_5::impl::msg_tracing_helpers::tracing_disabled_base> *
              )operator_new(0x38);
    limitful_mpsc_mbox_template<so_5::impl::msg_tracing_helpers::tracing_disabled_base>::
    limitful_mpsc_mbox_template<>(this_00,*args,*args_1,args_2);
    std::
    unique_ptr<so_5::abstract_message_box_t,_std::default_delete<so_5::abstract_message_box_t>_>::
    reset((unique_ptr<so_5::abstract_message_box_t,_std::default_delete<so_5::abstract_message_box_t>_>
           *)this,(pointer)this_00);
  }
  else {
    this_01 = (limitful_mpsc_mbox_template<so_5::impl::msg_tracing_helpers::tracing_enabled_base> *)
              operator_new(0x40);
    limitful_mpsc_mbox_template<so_5::impl::msg_tracing_helpers::tracing_enabled_base>::
    limitful_mpsc_mbox_template<so_5::msg_tracing::tracer_t&>(this_01,*args,*args_1,args_2,tracer);
    std::
    unique_ptr<so_5::abstract_message_box_t,_std::default_delete<so_5::abstract_message_box_t>_>::
    reset((unique_ptr<so_5::abstract_message_box_t,_std::default_delete<so_5::abstract_message_box_t>_>
           *)this,(pointer)this_01);
  }
  return (__uniq_ptr_data<so_5::abstract_message_box_t,_std::default_delete<so_5::abstract_message_box_t>,_true,_true>
          )(__uniq_ptr_data<so_5::abstract_message_box_t,_std::default_delete<so_5::abstract_message_box_t>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr< abstract_message_box_t >
make_actual_mbox(
	so_5::msg_tracing::tracer_t * tracer,
	A &&... args )
	{
		std::unique_ptr< abstract_message_box_t > result;
		if( !tracer )
			result.reset( new M1{ std::forward<A>(args)... } );
		else
			result.reset( new M2{ std::forward<A>(args)..., *tracer } );
		return result;
	}